

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O1

wchar_t archive_read_format_cab_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  long *plVar1;
  int64_t *piVar2;
  long *plVar3;
  wchar_t wVar4;
  ulong in_RAX;
  int64_t iVar5;
  ulong uVar6;
  void *pvVar7;
  ssize_t bytes_avail;
  ulong local_38;
  
  piVar2 = (int64_t *)a->format->data;
  if (0xfffc < *(ushort *)(piVar2[6] + 0x10)) {
    *buff = (void *)0x0;
    *size = 0;
    *offset = 0;
    archive_clear_error(&a->archive);
    archive_set_error(&a->archive,0x54,"Cannot restore this file split in multivolume.");
    uVar6 = 0xffffffe7;
    goto LAB_003a45b9;
  }
  local_38 = in_RAX;
  if (*(char *)((long)piVar2 + 0x94) == '\0') {
    if (piVar2[0x13] == 0) {
LAB_003a4559:
      *(undefined1 *)((long)piVar2 + 0x94) = 1;
      goto LAB_003a4561;
    }
    if (piVar2[7] == 0) {
      wVar4 = cab_next_cfdata(a);
      uVar6 = (ulong)(uint)wVar4;
      if (wVar4 < L'\0') goto LAB_003a45b9;
    }
    iVar5 = cab_consume_cfdata(a,piVar2[0x13]);
    if (-1 < iVar5) {
      piVar2[0x13] = 0;
      goto LAB_003a4559;
    }
  }
  else {
LAB_003a4561:
    if (piVar2[2] != 0) {
      uVar6 = cab_consume_cfdata(a,piVar2[2]);
      piVar2[2] = 0;
      if ((int)uVar6 < 0) goto LAB_003a45b9;
    }
    if ((*(char *)((long)piVar2 + 0x91) != '\0') || (*(char *)((long)piVar2 + 0x92) != '\0')) {
      if (*(char *)((long)piVar2 + 0x93) == '\0') {
        *(undefined1 *)((long)piVar2 + 0x93) = 1;
      }
      *offset = *piVar2;
      *size = 0;
      *buff = (void *)0x0;
      uVar6 = 1;
      goto LAB_003a45b9;
    }
    plVar3 = (long *)a->format->data;
    if (plVar3[1] == 0) {
      uVar6 = 0;
      *buff = (void *)0x0;
      *size = 0;
      *offset = *plVar3;
      *(undefined1 *)((long)plVar3 + 0x92) = 1;
      goto LAB_003a45b9;
    }
    pvVar7 = cab_read_ahead_cfdata(a,(ssize_t *)&local_38);
    *buff = pvVar7;
    if (0 < (long)local_38) {
      if (plVar3[1] < (long)local_38) {
        local_38 = plVar3[1];
      }
      *size = local_38;
      *offset = *plVar3;
      *plVar3 = *plVar3 + local_38;
      plVar1 = plVar3 + 1;
      *plVar1 = *plVar1 - local_38;
      if (*plVar1 == 0) {
        *(undefined1 *)((long)plVar3 + 0x92) = 1;
      }
      plVar3[2] = local_38;
      uVar6 = 0;
      if ((*(short *)(plVar3[5] + 6) == 0) && ((long)local_38 < *(long *)(plVar3[7] + 0x10))) {
        *(ulong *)(plVar3[7] + 0x10) = local_38;
      }
      goto LAB_003a45b9;
    }
    *buff = (void *)0x0;
    *size = 0;
    *offset = 0;
    uVar6 = local_38;
    if ((local_38 != 0) || (*(short *)(plVar3[7] + 8) != 0)) goto LAB_003a45b9;
    archive_set_error(&a->archive,0x54,"Invalid CFDATA");
  }
  uVar6 = 0xffffffe2;
LAB_003a45b9:
  return (wchar_t)uVar6;
}

Assistant:

static int
archive_read_format_cab_read_data(struct archive_read *a,
    const void **buff, size_t *size, int64_t *offset)
{
	struct cab *cab = (struct cab *)(a->format->data);
	int r;

	switch (cab->entry_cffile->folder) {
	case iFoldCONTINUED_FROM_PREV:
	case iFoldCONTINUED_TO_NEXT:
	case iFoldCONTINUED_PREV_AND_NEXT:
		*buff = NULL;
		*size = 0;
		*offset = 0;
		archive_clear_error(&a->archive);
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Cannot restore this file split in multivolume.");
		return (ARCHIVE_FAILED);
	default:
		break;
	}
	if (cab->read_data_invoked == 0) {
		if (cab->bytes_skipped) {
			if (cab->entry_cfdata == NULL) {
				r = cab_next_cfdata(a);
				if (r < 0)
					return (r);
			}
			if (cab_consume_cfdata(a, cab->bytes_skipped) < 0)
				return (ARCHIVE_FATAL);
			cab->bytes_skipped = 0;
		}
		cab->read_data_invoked = 1;
	}
	if (cab->entry_unconsumed) {
		/* Consume as much as the compressor actually used. */
		r = (int)cab_consume_cfdata(a, cab->entry_unconsumed);
		cab->entry_unconsumed = 0;
		if (r < 0)
			return (r);
	}
	if (cab->end_of_archive || cab->end_of_entry) {
		if (!cab->end_of_entry_cleanup) {
			/* End-of-entry cleanup done. */
			cab->end_of_entry_cleanup = 1;
		}
		*offset = cab->entry_offset;
		*size = 0;
		*buff = NULL;
		return (ARCHIVE_EOF);
	}

	return (cab_read_data(a, buff, size, offset));
}